

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

Vec3f __thiscall Model::normal(Model *this,int fi,int li)

{
  uint in_ECX;
  undefined4 in_register_00000034;
  long lVar1;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vec3f VVar2;
  
  lVar1 = CONCAT44(in_register_00000034,fi);
  if (-1 < li) {
    if ((in_ECX < 3) && (li < (int)((*(long *)(lVar1 + 0x20) - *(long *)(lVar1 + 0x18)) / 0x18))) {
      Vec3<float>::Vec3((Vec3<float> *)this,
                        (Vec3<float> *)
                        ((long)*(int *)(*(long *)(*(long *)(lVar1 + 0x18) + (ulong)(uint)li * 0x18)
                                        + 8 + (ulong)in_ECX * 0xc) * 0xc + *(long *)(lVar1 + 0x30)))
      ;
      VVar2.z = in_XMM1_Da;
      VVar2.x = (float)(int)extraout_XMM0_Qa;
      VVar2.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
      return VVar2;
    }
  }
  __assert_fail("fi>=0 && fi<nfaces() && li>=0 && li<3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/model.cpp"
                ,0x5c,"Vec3f Model::normal(int, int)");
}

Assistant:

Vec3f Model::normal(int fi, int li) {
    assert(fi>=0 && fi<nfaces() && li>=0 && li<3);
    return norms[faces[fi][li].z];
}